

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.h
# Opt level: O0

void __thiscall QDebug::QDebug(QDebug *this,QByteArray *bytes)

{
  QByteArray *ba;
  undefined8 *in_RDI;
  Stream *in_stack_ffffffffffffffe0;
  
  ba = (QByteArray *)operator_new(0x58);
  Stream::Stream(in_stack_ffffffffffffffe0,ba);
  *in_RDI = ba;
  return;
}

Assistant:

explicit QDebug(QByteArray *bytes) : stream(new Stream(bytes)) {}